

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taggedptr.h
# Opt level: O3

Float __thiscall pbrt::ShapeHandle::PDF(ShapeHandle *this,ShapeSampleContext *ctx,Vector3f wi)

{
  Point3f *pPVar1;
  float *s;
  float *pfVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined8 uVar9;
  ulong uVar10;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  int iVar26;
  int iVar27;
  BilinearPatchMesh *mesh;
  int *piVar28;
  Point3f *pPVar29;
  Transform *pTVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  byte bVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  bool bVar56;
  long lVar57;
  ulong uVar58;
  uint uVar59;
  long lVar60;
  long lVar61;
  undefined8 unaff_RBX;
  long lVar62;
  Sphere *this_00;
  Curve *this_01;
  long lVar63;
  bool bVar64;
  float fVar65;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [32];
  undefined1 auVar87 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar77 [32];
  undefined1 auVar79 [32];
  undefined1 auVar81 [32];
  undefined1 auVar74 [16];
  undefined1 in_YmmResult [32];
  undefined1 auVar83 [32];
  undefined1 auVar85 [32];
  Float FVar88;
  float fVar89;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 extraout_var_00 [56];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  float fVar103;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [32];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [32];
  undefined4 uVar134;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  float fVar146;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  float fVar154;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  Vector3f a;
  Vector3f a_00;
  Point3f PVar164;
  Vector3f b;
  Vector3f b_00;
  Vector3f c;
  Vector3f c_00;
  Vector3f d;
  Vector3f d_00;
  undefined1 auStack_238 [16];
  undefined1 auStack_228 [16];
  Tuple3<pbrt::Vector3,_float> TStack_208;
  undefined1 auStack_1f8 [16];
  undefined1 auStack_1e8 [16];
  float fStack_1d8;
  undefined4 uStack_1d4;
  undefined8 uStack_1d0;
  undefined1 auStack_1c8 [12];
  float fStack_1bc;
  undefined1 auStack_1b8 [16];
  undefined1 auStack_1a8 [12];
  float fStack_19c;
  undefined1 auStack_198 [12];
  float fStack_18c;
  undefined1 auStack_188 [8];
  undefined8 uStack_180;
  undefined1 auStack_178 [8];
  float fStack_170;
  undefined4 uStack_16c;
  undefined1 auStack_168 [24];
  undefined1 auStack_150 [8];
  undefined1 auStack_148 [32];
  undefined1 auStack_128 [208];
  Ray RStack_58;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  bool in_stack_ffffffffffffffd8;
  undefined1 auVar78 [32];
  undefined1 auVar80 [32];
  undefined1 auVar82 [32];
  undefined1 auVar84 [32];
  undefined1 auVar86 [32];
  undefined1 extraout_var [56];
  undefined1 extraout_var_01 [56];
  
  fStack_19c = SUB84(auStack_1a8._0_8_,4);
  fStack_18c = SUB84(auStack_198._0_8_,4);
  auVar72 = in_YmmResult._16_16_;
  TStack_208.z = wi.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar97._8_56_ = wi._8_56_;
  auVar97._0_8_ = wi.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  uVar58 = (this->
           super_TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
           ).bits;
  auVar73 = auVar97._0_16_;
  uVar59 = (uint)(ushort)(uVar58 >> 0x30);
  if (uVar58 >> 0x32 == 0) {
    this_00 = (Sphere *)(uVar58 & 0xffffffffffff);
    if (uVar58 >> 0x31 == 0) {
      auStack_178 = (undefined1  [8])vmovlps_avx(auVar73);
      fStack_170 = TStack_208.z;
      auVar75 = ZEXT816(0) << 0x40;
      pTVar30 = this_00->renderFromObject;
      auVar72 = vinsertps_avx(ZEXT416((uint)(pTVar30->m).m[0][1]),
                              ZEXT416((uint)(pTVar30->m).m[1][1]),0x10);
      auVar73 = vinsertps_avx(ZEXT416((uint)(pTVar30->m).m[0][2]),
                              ZEXT416((uint)(pTVar30->m).m[1][2]),0x10);
      auVar71 = vfmadd231ss_fma(ZEXT416((uint)((pTVar30->m).m[2][1] * 0.0)),auVar75,
                                ZEXT416((uint)(pTVar30->m).m[2][0]));
      auVar116 = vfmadd231ss_fma(ZEXT416((uint)((pTVar30->m).m[3][1] * 0.0)),auVar75,
                                 ZEXT416((uint)(pTVar30->m).m[3][0]));
      auVar74 = vfmadd231ss_fma(auVar71,auVar75,ZEXT416((uint)(pTVar30->m).m[2][2]));
      auVar116 = vfmadd231ss_fma(auVar116,auVar75,ZEXT416((uint)(pTVar30->m).m[3][2]));
      auVar71 = vinsertps_avx(ZEXT416((uint)(pTVar30->m).m[0][0]),
                              ZEXT416((uint)(pTVar30->m).m[1][0]),0x10);
      auVar75._0_4_ = auVar72._0_4_ * 0.0;
      auVar75._4_4_ = auVar72._4_4_ * 0.0;
      auVar75._8_4_ = auVar72._8_4_ * 0.0;
      auVar75._12_4_ = auVar72._12_4_ * 0.0;
      fVar89 = auVar116._0_4_ + (pTVar30->m).m[3][3];
      fVar146 = auVar74._0_4_ + (pTVar30->m).m[2][3];
      bVar56 = fVar89 == 1.0;
      auVar72 = vfmadd213ps_fma(auVar71,ZEXT816(0) << 0x40,auVar75);
      auVar73 = vfmadd213ps_fma(auVar73,ZEXT816(0) << 0x40,auVar72);
      auVar72 = vinsertps_avx(ZEXT416((uint)(pTVar30->m).m[0][3]),
                              ZEXT416((uint)(pTVar30->m).m[1][3]),0x10);
      auVar71._4_4_ = fVar89;
      auVar71._0_4_ = fVar89;
      auVar71._8_4_ = fVar89;
      auVar71._12_4_ = fVar89;
      uVar59 = 0xff;
      if (!bVar56) {
        uVar59 = 0;
      }
      uVar58 = (ulong)uVar59;
      if (NAN(fVar89)) {
        uVar58 = 0;
      }
      auVar67._0_4_ = auVar73._0_4_ + auVar72._0_4_;
      auVar67._4_4_ = auVar73._4_4_ + auVar72._4_4_;
      auVar67._8_4_ = auVar73._8_4_ + auVar72._8_4_;
      auVar67._12_4_ = auVar73._12_4_ + auVar72._12_4_;
      auVar72 = vdivps_avx(auVar67,auVar71);
      bVar64 = (bool)((byte)uVar58 & 1);
      auStack_168._16_4_ = (uint)bVar64 * (int)auVar67._0_4_ | (uint)!bVar64 * auVar72._0_4_;
      bVar64 = (bool)((byte)(uVar58 >> 1) & 1);
      auStack_168._20_4_ = (uint)bVar64 * (int)auVar67._4_4_ | (uint)!bVar64 * auVar72._4_4_;
      bVar64 = (bool)((byte)(uVar58 >> 2) & 1);
      auStack_150._0_4_ = (uint)bVar64 * (int)auVar67._8_4_ | (uint)!bVar64 * auVar72._8_4_;
      bVar64 = (bool)((byte)(uVar58 >> 3) & 1);
      auStack_150._4_4_ = (uint)bVar64 * (int)auVar67._12_4_ | (uint)!bVar64 * auVar72._12_4_;
      uVar9 = *(undefined8 *)
               &(ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.
                high;
      auStack_168._0_4_ = (uint)bVar56 * (int)fVar146 + (uint)!bVar56 * (int)(fVar146 / fVar89);
      auVar72._0_4_ =
           (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
      auVar72._4_4_ =
           (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
      auVar72._8_4_ =
           (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
      auVar72._12_4_ =
           (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
      auVar72 = vinsertps_avx(auVar72,ZEXT416((uint)(ctx->pi).super_Point3<pbrt::Interval>.
                                                    super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
                                                    high),0x10);
      auStack_168._4_4_ = 0;
      auStack_168._8_4_ = 0;
      auStack_168._12_4_ = 0;
      auStack_148._8_4_ =
           (float)auStack_168._0_4_ +
           ((ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low
           + (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.
             high) * -0.5;
      auVar74._0_4_ = (float)uVar9 + auVar72._0_4_;
      auVar74._4_4_ = (float)((ulong)uVar9 >> 0x20) + auVar72._4_4_;
      auVar74._8_4_ = auVar72._8_4_ + 0.0;
      auVar74._12_4_ = auVar72._12_4_ + 0.0;
      auVar73._8_4_ = 0xbf000000;
      auVar73._0_8_ = 0xbf000000bf000000;
      auVar73._12_4_ = 0xbf000000;
      auVar72 = vmulps_avx512vl(auVar74,auVar73);
      auVar70._0_4_ = (float)auStack_168._16_4_ + auVar72._0_4_;
      auVar70._4_4_ = (float)auStack_168._20_4_ + auVar72._4_4_;
      auVar70._8_4_ = (float)auStack_150._0_4_ + auVar72._8_4_;
      auVar70._12_4_ = (float)auStack_150._4_4_ + auVar72._12_4_;
      auVar97._8_56_ = ZEXT856(auVar70._8_8_);
      uVar9 = vmovlps_avx(auVar70);
      auStack_148._0_4_ = (undefined4)uVar9;
      auStack_148._4_4_ = (undefined4)((ulong)uVar9 >> 0x20);
      uStack_180 = 0x2e481e;
      PVar164 = ShapeSampleContext::OffsetRayOrigin(ctx,(Vector3f *)auStack_148);
      auVar98._0_8_ = PVar164.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar98._8_56_ = auVar97._8_56_;
      auVar116._4_4_ = auStack_168._20_4_;
      auVar116._0_4_ = auStack_168._16_4_;
      auVar116._8_4_ = auStack_150._0_4_;
      auVar116._12_4_ = auStack_150._4_4_;
      auVar72 = vsubps_avx(auVar98._0_16_,auVar116);
      fVar146 = PVar164.super_Tuple3<pbrt::Point3,_float>.z - (float)auStack_168._0_4_;
      auVar66._0_4_ = auVar72._0_4_ * auVar72._0_4_;
      auVar66._4_4_ = auVar72._4_4_ * auVar72._4_4_;
      auVar66._8_4_ = auVar72._8_4_ * auVar72._8_4_;
      auVar66._12_4_ = auVar72._12_4_ * auVar72._12_4_;
      auVar72 = vhaddps_avx(auVar66,auVar66);
      fVar89 = this_00->radius * this_00->radius;
      auVar97._8_56_ = (undefined1  [56])0x0;
      if (fVar146 * fVar146 + auVar72._0_4_ <= fVar89) {
        uStack_180 = 0x2e48f5;
        PVar164 = ShapeSampleContext::OffsetRayOrigin(ctx,(Vector3f *)auStack_178);
        RStack_58.medium.
        super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
        .bits._0_4_ = PVar164.super_Tuple3<pbrt::Point3,_float>.z;
        auVar99._0_8_ = PVar164.super_Tuple3<pbrt::Point3,_float>._0_8_;
        auVar99._8_56_ = auVar97._8_56_;
        RStack_58._24_8_ = vmovlps_avx(auVar99._0_16_);
        RStack_58.medium.
        super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
        .bits._4_4_ = auStack_178._0_4_;
        uStack_30 = auStack_178._4_4_;
        uStack_2c = fStack_170;
        uStack_180 = 0x2e4945;
        auStack_128._8_12_ = auStack_128._16_12_;
        Sphere::Intersect((optional<pbrt::ShapeIntersection> *)auStack_148,this_00,
                          (Ray *)&RStack_58.time,INFINITY);
        fVar89 = 0.0;
        if ((bool)RStack_58.d.super_Tuple3<pbrt::Vector3,_float>.y._0_1_ == true) {
          auVar54._4_4_ = auStack_148._8_4_;
          auVar54._0_4_ = auStack_148._4_4_;
          auVar54._8_4_ = auStack_148._12_4_;
          auVar54._12_4_ = auStack_148._16_4_;
          auVar52._4_4_ = auStack_148._4_4_;
          auVar52._0_4_ = auStack_148._0_4_;
          auVar52._8_4_ = auStack_148._8_4_;
          auVar52._12_4_ = auStack_148._12_4_;
          auVar72 = vinsertps_avx(auVar54,ZEXT416((uint)auStack_148._20_4_),0x10);
          auVar69._8_4_ = 0x80000000;
          auVar69._0_8_ = 0x8000000080000000;
          auVar69._12_4_ = 0x80000000;
          auVar73 = vxorps_avx512vl(ZEXT416((uint)fStack_170),auVar69);
          auVar73 = ZEXT416((uint)((float)auStack_128._16_4_ * auVar73._0_4_));
          auVar71 = vfnmadd132ss_fma(ZEXT416((uint)auStack_128._12_4_),auVar73,
                                     ZEXT416((uint)auStack_178._4_4_));
          auVar116 = vfnmsub213ss_fma(ZEXT416((uint)fStack_170),ZEXT416((uint)auStack_128._16_4_),
                                      auVar73);
          auVar68._0_4_ =
               (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.
               low;
          auVar68._4_4_ =
               (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.
               high;
          auVar68._8_4_ =
               (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
               low;
          auVar68._12_4_ =
               (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
               high;
          auVar73 = vinsertps_avx(auVar68,ZEXT416((uint)(ctx->pi).super_Point3<pbrt::Interval>.
                                                        super_Tuple3<pbrt::Point3,_pbrt::Interval>.z
                                                        .low),0x10);
          auVar116 = vfnmadd231ss_fma(ZEXT416((uint)(auVar71._0_4_ + auVar116._0_4_)),
                                      ZEXT416((uint)auStack_128._8_4_),
                                      ZEXT416((uint)auStack_178._0_4_));
          auVar71 = vinsertps_avx(*(undefined1 (*) [16])
                                   &(ctx->pi).super_Point3<pbrt::Interval>.
                                    super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high,
                                  ZEXT416((uint)(ctx->pi).super_Point3<pbrt::Interval>.
                                                super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high),
                                  0x10);
          auVar87._8_4_ = 0x7fffffff;
          auVar87._0_8_ = 0x7fffffff7fffffff;
          auVar87._12_4_ = 0x7fffffff;
          auVar74 = vandps_avx512vl(auVar116,auVar87);
          fVar89 = ((ctx->pi).super_Point3<pbrt::Interval>.
                    super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low +
                   (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>
                   .y.high) * 0.5 - ((float)auStack_148._8_4_ + (float)auStack_148._12_4_) * 0.5;
          auVar116 = vinsertps_avx(auVar52,ZEXT416((uint)auStack_148._16_4_),0x10);
          auVar119._0_4_ = (auVar73._0_4_ + auVar71._0_4_) * 0.5;
          auVar119._4_4_ = (auVar73._4_4_ + auVar71._4_4_) * 0.5;
          auVar119._8_4_ = (auVar73._8_4_ + auVar71._8_4_) * 0.5;
          auVar119._12_4_ = (auVar73._12_4_ + auVar71._12_4_) * 0.5;
          auVar127._0_4_ = (auVar116._0_4_ + auVar72._0_4_) * 0.5;
          auVar127._4_4_ = (auVar116._4_4_ + auVar72._4_4_) * 0.5;
          auVar127._8_4_ = (auVar116._8_4_ + auVar72._8_4_) * 0.5;
          auVar127._12_4_ = (auVar116._12_4_ + auVar72._12_4_) * 0.5;
          auVar72 = vsubps_avx(auVar119,auVar127);
          auVar120._0_4_ = auVar72._0_4_ * auVar72._0_4_;
          auVar120._4_4_ = auVar72._4_4_ * auVar72._4_4_;
          auVar120._8_4_ = auVar72._8_4_ * auVar72._8_4_;
          auVar120._12_4_ = auVar72._12_4_ * auVar72._12_4_;
          auVar72 = vmovshdup_avx(auVar120);
          fVar89 = (1.0 / (this_00->phiMax * this_00->radius * (this_00->zMax - this_00->zMin))) /
                   (auVar74._0_4_ / (auVar120._0_4_ + fVar89 * fVar89 + auVar72._0_4_));
          fVar89 = (float)((uint)(ABS(fVar89) != INFINITY) * (int)fVar89);
        }
      }
      else {
        auVar20._0_4_ =
             (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low
        ;
        auVar20._4_4_ =
             (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.
             high;
        auVar20._8_4_ =
             (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low
        ;
        auVar20._12_4_ =
             (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
             high;
        auVar72 = vinsertps_avx(auVar20,ZEXT416((uint)(ctx->pi).super_Point3<pbrt::Interval>.
                                                      super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
                                                      high),0x10);
        auStack_168._0_4_ =
             ((ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.
              low + (ctx->pi).super_Point3<pbrt::Interval>.
                    super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) * 0.5 -
             (float)auStack_168._0_4_;
        uVar9 = *(undefined8 *)
                 &(ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.
                  x.high;
        auVar107._0_4_ = (float)uVar9 + auVar72._0_4_;
        auVar107._4_4_ = (float)((ulong)uVar9 >> 0x20) + auVar72._4_4_;
        auVar107._8_4_ = auVar72._8_4_ + 0.0;
        auVar107._12_4_ = auVar72._12_4_ + 0.0;
        auVar33._8_4_ = 0x3f000000;
        auVar33._0_8_ = 0x3f0000003f000000;
        auVar33._12_4_ = 0x3f000000;
        auVar72 = vmulps_avx512vl(auVar107,auVar33);
        auVar72 = vsubps_avx(auVar72,auVar116);
        auVar108._0_4_ = auVar72._0_4_ * auVar72._0_4_;
        auVar108._4_4_ = auVar72._4_4_ * auVar72._4_4_;
        auVar108._8_4_ = auVar72._8_4_ * auVar72._8_4_;
        auVar108._12_4_ = auVar72._12_4_ * auVar72._12_4_;
        auVar72 = vhaddps_avx(auVar108,auVar108);
        auVar92._0_4_ =
             fVar89 / (auVar72._0_4_ + (float)auStack_168._0_4_ * (float)auStack_168._0_4_);
        auVar92._4_12_ = SUB6012((undefined1  [60])0x0,0);
        uVar9 = vcmpss_avx512f(auVar92,ZEXT416(0x3a33a102),1);
        bVar56 = (bool)((byte)uVar9 & 1);
        auVar72 = vmaxss_avx(ZEXT416((uint)(1.0 - auVar92._0_4_)),ZEXT816(0) << 0x20);
        auVar72 = vsqrtss_avx(auVar72,auVar72);
        fVar89 = 1.0 / ((float)((uint)bVar56 * (int)(auVar92._0_4_ * 0.5) +
                               (uint)!bVar56 * (int)(1.0 - auVar72._0_4_)) * 6.2831855);
      }
      return fVar89;
    }
    if (uVar59 != 2) {
      FVar88 = Disk::PDF((Disk *)this_00,ctx,wi);
      return FVar88;
    }
    uVar9 = vmovlps_avx(auVar73);
    auStack_168._16_4_ = (undefined4)uVar9;
    auStack_168._20_4_ = (undefined4)((ulong)uVar9 >> 0x20);
    auStack_168._8_4_ = 0x2e6d29;
    auStack_168._12_4_ = 0;
    auStack_150._0_4_ = TStack_208.z;
    PVar164 = ShapeSampleContext::OffsetRayOrigin(ctx,(Vector3f *)(auStack_168 + 0x10));
    RStack_58.medium.
    super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
    .bits._0_4_ = PVar164.super_Tuple3<pbrt::Point3,_float>.z;
    auVar100._0_8_ = PVar164.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar100._8_56_ = auVar97._8_56_;
    RStack_58._24_8_ = vmovlps_avx(auVar100._0_16_);
    RStack_58.medium.
    super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
    .bits._4_4_ = auStack_168._16_4_;
    uStack_30 = auStack_168._20_4_;
    uStack_2c = auStack_150._0_4_;
    auStack_168._8_4_ = 0x2e6d79;
    auStack_168._12_4_ = 0;
    auStack_128._8_12_ = auStack_128._16_12_;
    Cylinder::Intersect((optional<pbrt::ShapeIntersection> *)auStack_148,(Cylinder *)this_00,
                        (Ray *)&RStack_58.time,INFINITY);
    FVar88 = 0.0;
    if ((bool)RStack_58.d.super_Tuple3<pbrt::Vector3,_float>.y._0_1_ == true) {
      auVar55._4_4_ = auStack_148._8_4_;
      auVar55._0_4_ = auStack_148._4_4_;
      auVar55._8_4_ = auStack_148._12_4_;
      auVar55._12_4_ = auStack_148._16_4_;
      auVar53._4_4_ = auStack_148._4_4_;
      auVar53._0_4_ = auStack_148._0_4_;
      auVar53._8_4_ = auStack_148._8_4_;
      auVar53._12_4_ = auStack_148._12_4_;
      auVar72 = vinsertps_avx(auVar55,ZEXT416((uint)auStack_148._20_4_),0x10);
      auVar31._8_4_ = 0x80000000;
      auVar31._0_8_ = 0x8000000080000000;
      auVar31._12_4_ = 0x80000000;
      auVar73 = vxorps_avx512vl(ZEXT416((uint)auStack_150._0_4_),auVar31);
      auVar73 = ZEXT416((uint)((float)auStack_128._16_4_ * auVar73._0_4_));
      auVar71 = vfnmadd132ss_fma(ZEXT416((uint)auStack_128._12_4_),auVar73,
                                 ZEXT416((uint)auStack_168._20_4_));
      auVar116 = vfnmsub213ss_fma(ZEXT416((uint)auStack_150._0_4_),ZEXT416((uint)auStack_128._16_4_)
                                  ,auVar73);
      auVar21._0_4_ =
           (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
      auVar21._4_4_ =
           (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
      auVar21._8_4_ =
           (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
      auVar21._12_4_ =
           (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
      auVar73 = vinsertps_avx(auVar21,ZEXT416((uint)(ctx->pi).super_Point3<pbrt::Interval>.
                                                    super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low
                                             ),0x10);
      auVar116 = vfnmadd231ss_fma(ZEXT416((uint)(auVar71._0_4_ + auVar116._0_4_)),
                                  ZEXT416((uint)auStack_128._8_4_),ZEXT416((uint)auStack_168._16_4_)
                                 );
      auVar71 = vinsertps_avx(*(undefined1 (*) [16])
                               &(ctx->pi).super_Point3<pbrt::Interval>.
                                super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high,
                              ZEXT416((uint)(ctx->pi).super_Point3<pbrt::Interval>.
                                            super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high),0x10)
      ;
      auVar32._8_4_ = 0x7fffffff;
      auVar32._0_8_ = 0x7fffffff7fffffff;
      auVar32._12_4_ = 0x7fffffff;
      auVar74 = vandps_avx512vl(auVar116,auVar32);
      fVar89 = ((ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
                low + (ctx->pi).super_Point3<pbrt::Interval>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high) * 0.5 -
               ((float)auStack_148._8_4_ + (float)auStack_148._12_4_) * 0.5;
      auVar116 = vinsertps_avx(auVar53,ZEXT416((uint)auStack_148._16_4_),0x10);
      auVar121._0_4_ = (auVar73._0_4_ + auVar71._0_4_) * 0.5;
      auVar121._4_4_ = (auVar73._4_4_ + auVar71._4_4_) * 0.5;
      auVar121._8_4_ = (auVar73._8_4_ + auVar71._8_4_) * 0.5;
      auVar121._12_4_ = (auVar73._12_4_ + auVar71._12_4_) * 0.5;
      auVar128._0_4_ = (auVar116._0_4_ + auVar72._0_4_) * 0.5;
      auVar128._4_4_ = (auVar116._4_4_ + auVar72._4_4_) * 0.5;
      auVar128._8_4_ = (auVar116._8_4_ + auVar72._8_4_) * 0.5;
      auVar128._12_4_ = (auVar116._12_4_ + auVar72._12_4_) * 0.5;
      auVar72 = vsubps_avx(auVar121,auVar128);
      auVar122._0_4_ = auVar72._0_4_ * auVar72._0_4_;
      auVar122._4_4_ = auVar72._4_4_ * auVar72._4_4_;
      auVar122._8_4_ = auVar72._8_4_ * auVar72._8_4_;
      auVar122._12_4_ = auVar72._12_4_ * auVar72._12_4_;
      auVar72 = vmovshdup_avx(auVar122);
      fVar89 = (1.0 / ((*(float *)((long)&this_00->renderFromObject + 4) -
                       *(float *)&this_00->renderFromObject) * this_00->phiMax *
                      *(float *)&this_00->objectFromRender)) /
               (auVar74._0_4_ / (auVar122._0_4_ + fVar89 * fVar89 + auVar72._0_4_));
      FVar88 = (Float)((uint)(ABS(fVar89) != INFINITY) * (int)fVar89);
    }
    return FVar88;
  }
  uVar59 = uVar59 - 3;
  this_01 = (Curve *)(uVar58 & 0xffffffffffff);
  if (uVar59 < 2) {
    auStack_1c8._0_8_ = vmovlps_avx(auVar73);
    stack0xfffffffffffffe40 = CONCAT44(fStack_1bc,TStack_208.z);
    auVar22._0_4_ =
         (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
    auVar22._4_4_ =
         (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
    auVar22._8_4_ =
         (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
    auVar22._12_4_ =
         (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
    uVar9 = *(undefined8 *)
             &(ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.
              high;
    auVar73 = vinsertps_avx(auVar22,ZEXT416((uint)(ctx->pi).super_Point3<pbrt::Interval>.
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high)
                            ,0x10);
    auVar93._0_4_ = (float)uVar9 + auVar73._0_4_;
    auVar93._4_4_ = (float)((ulong)uVar9 >> 0x20) + auVar73._4_4_;
    auVar93._8_4_ = auVar73._8_4_ + 0.0;
    auVar93._12_4_ = auVar73._12_4_ + 0.0;
    auVar39._8_4_ = 0x3f000000;
    auVar39._0_8_ = 0x3f0000003f000000;
    auVar39._12_4_ = 0x3f000000;
    auVar73 = vmulps_avx512vl(auVar93,auVar39);
    uVar9 = vmovlps_avx(auVar73);
    auStack_128._8_4_ =
         ((ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low +
         (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) *
         0.5;
    auStack_128._0_8_ = uVar9;
    uStack_1d0 = 0x2e8bc3;
    FVar88 = Triangle::SolidAngle((Triangle *)this_01,(Point3f *)auStack_128);
    if ((FVar88 < 0.0002) || (6.22 < FVar88)) {
      uStack_1d0 = 0x2e8f37;
      auVar97._8_56_ = extraout_var_00;
      PVar164 = ShapeSampleContext::OffsetRayOrigin(ctx,(Vector3f *)auStack_1c8);
      auStack_148._0_4_ = PVar164.super_Tuple3<pbrt::Point3,_float>.z;
      auVar102._0_8_ = PVar164.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar102._8_56_ = auVar97._8_56_;
      auStack_148._16_4_ = ctx->time;
      uVar9 = vmovlps_avx(auVar102._0_16_);
      auStack_150._0_4_ = (undefined4)uVar9;
      auStack_150._4_4_ = (undefined4)((ulong)uVar9 >> 0x20);
      auStack_148._4_4_ = (undefined4)auStack_1c8._0_8_;
      auStack_148._8_4_ = SUB84(auStack_1c8._0_8_,4);
      auStack_148._12_4_ = auStack_1c8._8_4_;
      auStack_148._24_8_ = 0;
      uStack_1d0 = 0x2e8f87;
      Triangle::Intersect((optional<pbrt::ShapeIntersection> *)auStack_128,(Triangle *)this_01,
                          (Ray *)auStack_150,INFINITY);
      fVar89 = 0.0;
      if (in_stack_ffffffffffffffd8 == true) {
        uStack_1d0 = 0x2e8fa2;
        FVar88 = Triangle::Area((Triangle *)this_01);
        uVar134 = auStack_128._8_4_;
        auVar72 = auStack_128._4_16_;
        auVar74 = auStack_128._0_16_;
        auVar72 = vinsertps_avx(auVar72,ZEXT416((uint)auStack_128._20_4_),0x10);
        auVar43._8_4_ = 0x80000000;
        auVar43._0_8_ = 0x8000000080000000;
        auVar43._12_4_ = 0x80000000;
        auVar73 = vxorps_avx512vl(ZEXT416((uint)auStack_1c8._8_4_),auVar43);
        auVar73 = ZEXT416((uint)((float)auStack_128._48_4_ * auVar73._0_4_));
        auVar71 = vfnmadd132ss_fma(ZEXT416((uint)auStack_128._44_4_),auVar73,
                                   ZEXT416((uint)auStack_1c8._4_4_));
        auVar116 = vfnmsub213ss_fma(ZEXT416((uint)auStack_1c8._8_4_),
                                    ZEXT416((uint)auStack_128._48_4_),auVar73);
        auVar25._0_4_ =
             (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low
        ;
        auVar25._4_4_ =
             (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.
             high;
        auVar25._8_4_ =
             (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low
        ;
        auVar25._12_4_ =
             (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
             high;
        auVar73 = vinsertps_avx(auVar25,ZEXT416((uint)(ctx->pi).super_Point3<pbrt::Interval>.
                                                      super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.
                                                      low),0x10);
        auVar116 = vfnmadd231ss_fma(ZEXT416((uint)(auVar71._0_4_ + auVar116._0_4_)),
                                    ZEXT416((uint)auStack_128._40_4_),
                                    ZEXT416((uint)auStack_1c8._0_4_));
        auVar71 = vinsertps_avx(*(undefined1 (*) [16])
                                 &(ctx->pi).super_Point3<pbrt::Interval>.
                                  super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high,
                                ZEXT416((uint)(ctx->pi).super_Point3<pbrt::Interval>.
                                              super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high),
                                0x10);
        auVar44._8_4_ = 0x7fffffff;
        auVar44._0_8_ = 0x7fffffff7fffffff;
        auVar44._12_4_ = 0x7fffffff;
        auVar75 = vandps_avx512vl(auVar116,auVar44);
        fVar89 = ((ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.
                  y.low + (ctx->pi).super_Point3<pbrt::Interval>.
                          super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high) * 0.5 -
                 ((float)uVar134 + (float)auStack_128._12_4_) * 0.5;
        auVar116 = vinsertps_avx(auVar74,ZEXT416((uint)auStack_128._16_4_),0x10);
        auVar123._0_4_ = (auVar73._0_4_ + auVar71._0_4_) * 0.5;
        auVar123._4_4_ = (auVar73._4_4_ + auVar71._4_4_) * 0.5;
        auVar123._8_4_ = (auVar73._8_4_ + auVar71._8_4_) * 0.5;
        auVar123._12_4_ = (auVar73._12_4_ + auVar71._12_4_) * 0.5;
        auVar132._0_4_ = (auVar116._0_4_ + auVar72._0_4_) * 0.5;
        auVar132._4_4_ = (auVar116._4_4_ + auVar72._4_4_) * 0.5;
        auVar132._8_4_ = (auVar116._8_4_ + auVar72._8_4_) * 0.5;
        auVar132._12_4_ = (auVar116._12_4_ + auVar72._12_4_) * 0.5;
        auVar72 = vsubps_avx(auVar123,auVar132);
        auVar124._0_4_ = auVar72._0_4_ * auVar72._0_4_;
        auVar124._4_4_ = auVar72._4_4_ * auVar72._4_4_;
        auVar124._8_4_ = auVar72._8_4_ * auVar72._8_4_;
        auVar124._12_4_ = auVar72._12_4_ * auVar72._12_4_;
        auVar72 = vmovshdup_avx(auVar124);
        fVar89 = (1.0 / FVar88) /
                 (auVar75._0_4_ / (auVar124._0_4_ + fVar89 * fVar89 + auVar72._0_4_));
        fVar89 = (float)((uint)(ABS(fVar89) != INFINITY) * (int)fVar89);
      }
    }
    else {
      fVar89 = 1.0 / FVar88;
      auStack_1b8 = ZEXT416((uint)fVar89);
      if (((((ctx->ns).super_Tuple3<pbrt::Normal3,_float>.x != 0.0) ||
           ((ctx->ns).super_Tuple3<pbrt::Normal3,_float>.y != 0.0)) ||
          (fVar146 = (ctx->ns).super_Tuple3<pbrt::Normal3,_float>.z, fVar146 != 0.0)) ||
         (NAN(fVar146))) {
        lVar61 = (long)*(int *)((long)&this_01->common + 4);
        lVar57 = *(long *)(*(long *)(Triangle::allMeshes + 8) + (long)*(int *)&this_01->common * 8);
        lVar60 = *(long *)(lVar57 + 8);
        lVar57 = *(long *)(lVar57 + 0x10);
        lVar62 = (long)*(int *)(lVar60 + lVar61 * 0xc);
        lVar63 = (long)*(int *)(lVar60 + 4 + lVar61 * 0xc);
        lVar60 = (long)*(int *)(lVar60 + 8 + lVar61 * 0xc);
        uStack_180 = 0;
        auStack_188 = (undefined1  [8])*(ulong *)(lVar57 + 4 + lVar62 * 0xc);
        auStack_168._0_4_ = *(uint *)(lVar57 + lVar62 * 0xc);
        uVar58 = *(ulong *)(lVar57 + 4 + lVar63 * 0xc);
        register0x00001308 = 0;
        auStack_198._0_8_ = uVar58;
        uVar10 = *(ulong *)(lVar57 + lVar60 * 0xc);
        register0x00001288 = 0;
        auStack_1a8._0_8_ = uVar10;
        auStack_128._32_4_ = *(float *)(lVar57 + 8 + lVar60 * 0xc);
        auVar73 = vpermi2ps_avx512vl(_DAT_003c7750,_auStack_188,ZEXT416((uint)auStack_168._0_4_));
        _auStack_178 = ZEXT416(*(uint *)(lVar57 + lVar63 * 0xc));
        auStack_168._4_4_ = 0;
        auStack_168._8_4_ = 0;
        auStack_168._12_4_ = 0;
        auVar73 = vinsertps_avx(auVar73,_auStack_178,0x30);
        auVar111._16_8_ = uVar58;
        auVar111._0_16_ = auVar73;
        auVar111._24_8_ = 0;
        auVar76._16_8_ = uVar10;
        auVar76._0_16_ = auVar73;
        auVar76._24_8_ = 0;
        auStack_128._0_32_ = vshufpd_avx(auVar111,auVar76,2);
        auVar23._0_4_ =
             (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low
        ;
        auVar23._4_4_ =
             (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.
             high;
        auVar23._8_4_ =
             (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low
        ;
        auVar23._12_4_ =
             (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
             high;
        uVar9 = *(undefined8 *)
                 &(ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.
                  x.high;
        auVar73 = vinsertps_avx(auVar23,ZEXT416((uint)(ctx->pi).super_Point3<pbrt::Interval>.
                                                      super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
                                                      high),0x10);
        auVar94._0_4_ = (float)uVar9 + auVar73._0_4_;
        auVar94._4_4_ = (float)((ulong)uVar9 >> 0x20) + auVar73._4_4_;
        auVar94._8_4_ = auVar73._8_4_ + 0.0;
        auVar94._12_4_ = auVar73._12_4_ + 0.0;
        auVar40._8_4_ = 0x3f000000;
        auVar40._0_8_ = 0x3f0000003f000000;
        auVar40._12_4_ = 0x3f000000;
        auVar73 = vmulps_avx512vl(auVar94,auVar40);
        auStack_148._0_4_ =
             ((ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.
              low + (ctx->pi).super_Point3<pbrt::Interval>.
                    super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) * 0.5;
        uVar9 = vmovlps_avx(auVar73);
        auStack_150._0_4_ = (undefined4)uVar9;
        auStack_150._4_4_ = (undefined4)((ulong)uVar9 >> 0x20);
        uStack_1d0 = 0x2e8d27;
        fStack_1bc = (float)auStack_128._32_4_;
        auVar101._0_8_ =
             InvertSphericalTriangleSample
                       ((array<pbrt::Point3<float>,_3> *)auStack_128,(Point3f *)auStack_150,
                        (Vector3f *)auStack_1c8);
        auVar101._8_56_ = extraout_var_01;
        auVar24._0_4_ =
             (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low
        ;
        auVar24._4_4_ =
             (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.
             high;
        auVar24._8_4_ =
             (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low
        ;
        auVar24._12_4_ =
             (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
             high;
        uVar9 = *(undefined8 *)
                 &(ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.
                  x.high;
        auVar50._4_4_ = auStack_168._4_4_;
        auVar50._0_4_ = auStack_168._0_4_;
        auVar50._8_4_ = auStack_168._8_4_;
        auVar50._12_4_ = auStack_168._12_4_;
        fVar89 = 0.0;
        auVar73 = vinsertps_avx(auVar24,ZEXT416((uint)(ctx->pi).super_Point3<pbrt::Interval>.
                                                      super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
                                                      high),0x10);
        auVar71 = vinsertps_avx(auVar50,ZEXT416((uint)auStack_178._0_4_),0x10);
        fVar65 = auVar101._0_4_;
        fVar154 = ((ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>
                   .z.low + (ctx->pi).super_Point3<pbrt::Interval>.
                            super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) * 0.5;
        auVar109._0_4_ = (float)uVar9 + auVar73._0_4_;
        auVar109._4_4_ = (float)((ulong)uVar9 >> 0x20) + auVar73._4_4_;
        auVar109._8_4_ = auVar73._8_4_ + 0.0;
        auVar109._12_4_ = auVar73._12_4_ + 0.0;
        auVar41._8_4_ = 0x3f000000;
        auVar41._0_8_ = 0x3f0000003f000000;
        auVar41._12_4_ = 0x3f000000;
        auVar70 = vmulps_avx512vl(auVar109,auVar41);
        auVar73 = vinsertps_avx(_auStack_198,_auStack_188,0x4c);
        auVar129._4_4_ = fVar154;
        auVar129._0_4_ = fVar154;
        auVar129._8_4_ = fVar154;
        auVar129._12_4_ = fVar154;
        auVar74 = vsubps_avx(auVar73,auVar129);
        uVar134 = auVar70._0_4_;
        auVar144._4_4_ = uVar134;
        auVar144._0_4_ = uVar134;
        auVar144._8_4_ = uVar134;
        auVar144._12_4_ = uVar134;
        auVar75 = vsubps_avx(auVar71,auVar144);
        auVar73 = vinsertps_avx(_auStack_188,_auStack_198,0x1c);
        auVar71 = vmovshdup_avx(auVar70);
        auVar71 = vsubps_avx(auVar73,auVar71);
        auVar130._0_4_ =
             auVar71._0_4_ * auVar71._0_4_ + auVar75._0_4_ * auVar75._0_4_ +
             auVar74._0_4_ * auVar74._0_4_;
        auVar130._4_4_ =
             auVar71._4_4_ * auVar71._4_4_ + auVar75._4_4_ * auVar75._4_4_ +
             auVar74._4_4_ * auVar74._4_4_;
        auVar130._8_4_ =
             auVar71._8_4_ * auVar71._8_4_ + auVar75._8_4_ * auVar75._8_4_ +
             auVar74._8_4_ * auVar74._8_4_;
        auVar130._12_4_ =
             auVar71._12_4_ * auVar71._12_4_ + auVar75._12_4_ * auVar75._12_4_ +
             auVar74._12_4_ * auVar74._12_4_;
        auVar116 = vsqrtps_avx(auVar130);
        fVar146 = (ctx->ns).super_Tuple3<pbrt::Normal3,_float>.z;
        auVar131._4_4_ = fVar146;
        auVar131._0_4_ = fVar146;
        auVar131._8_4_ = fVar146;
        auVar131._12_4_ = fVar146;
        auVar73 = vdivps_avx(auVar74,auVar116);
        auVar71 = vdivps_avx(auVar71,auVar116);
        auVar116 = vdivps_avx(auVar75,auVar116);
        fVar103 = (ctx->ns).super_Tuple3<pbrt::Normal3,_float>.y;
        auVar141._4_4_ = fVar103;
        auVar141._0_4_ = fVar103;
        auVar141._8_4_ = fVar103;
        auVar141._12_4_ = fVar103;
        auVar149._0_4_ = fVar146 * auVar73._0_4_;
        auVar149._4_4_ = fVar146 * auVar73._4_4_;
        auVar149._8_4_ = fVar146 * auVar73._8_4_;
        auVar149._12_4_ = fVar146 * auVar73._12_4_;
        auVar71 = vfmadd213ps_fma(auVar71,auVar141,auVar149);
        auVar73 = vfmsub213ps_fma(auVar73,auVar131,auVar149);
        auVar110._0_4_ = auVar71._0_4_ + auVar73._0_4_;
        auVar110._4_4_ = auVar71._4_4_ + auVar73._4_4_;
        auVar110._8_4_ = auVar71._8_4_ + auVar73._8_4_;
        auVar110._12_4_ = auVar71._12_4_ + auVar73._12_4_;
        fVar103 = (ctx->ns).super_Tuple3<pbrt::Normal3,_float>.x;
        auVar145._4_4_ = fVar103;
        auVar145._0_4_ = fVar103;
        auVar145._8_4_ = fVar103;
        auVar145._12_4_ = fVar103;
        auVar73 = vfmadd231ps_fma(auVar110,auVar145,auVar116);
        auVar153._8_4_ = 0x7fffffff;
        auVar153._0_8_ = 0x7fffffff7fffffff;
        auVar153._12_4_ = 0x7fffffff;
        auVar73 = vandps_avx(auVar153,auVar73);
        auVar42._8_4_ = 0x3c23d70a;
        auVar42._0_8_ = 0x3c23d70a3c23d70a;
        auVar42._12_4_ = 0x3c23d70a;
        uVar58 = vcmpps_avx512vl(auVar73,auVar42,0xe);
        if ((0.0 <= fVar65) && (fVar65 <= 1.0)) {
          auVar71 = vmovshdup_avx(auVar101._0_16_);
          fVar103 = auVar71._0_4_;
          if ((0.0 <= fVar103) && (fVar103 <= 1.0)) {
            bVar46 = (byte)(uVar58 >> 1);
            auVar116 = vshufps_avx(auVar73,auVar73,0xf5);
            fStack_1bc = fStack_1bc - fVar154;
            auVar74 = vsubps_avx(_auStack_1a8,auVar70);
            fVar89 = auVar74._0_4_;
            auVar156._0_4_ = fVar89 * fVar89;
            auVar156._4_4_ = auVar74._4_4_ * auVar74._4_4_;
            auVar156._8_4_ = auVar74._8_4_ * auVar74._8_4_;
            auVar156._12_4_ = auVar74._12_4_ * auVar74._12_4_;
            auVar71 = vhaddps_avx(auVar156,auVar156);
            auVar71 = ZEXT416((uint)(auVar71._0_4_ + fStack_1bc * fStack_1bc));
            auVar71 = vsqrtss_avx(auVar71,auVar71);
            fVar154 = auVar71._0_4_;
            auVar158._0_4_ = fVar89 / fVar154;
            auVar158._4_12_ = auVar74._4_12_;
            auVar71 = vmovshdup_avx(auVar74);
            auVar160._0_4_ = auVar71._0_4_ / fVar154;
            auVar160._4_12_ = auVar71._4_12_;
            auVar74 = SUB6416(ZEXT464(0x3c23d70a),0);
            auVar84._16_16_ = auVar72;
            auVar84._0_16_ = auVar74;
            auVar83._4_28_ = auVar84._4_28_;
            auVar83._0_4_ =
                 (float)((uint)(bVar46 & 1) * auVar116._0_4_ +
                        (uint)!(bool)(bVar46 & 1) * 0x3c23d70a);
            auVar116 = ZEXT416((uint)((fStack_1bc / fVar154) * fVar146));
            auVar71 = vfmadd213ss_fma(auVar160,auVar141,auVar116);
            auVar116 = vfmsub213ss_fma(ZEXT416((uint)(fStack_1bc / fVar154)),auVar131,auVar116);
            auVar71 = vfmadd231ss_fma(ZEXT416((uint)(auVar71._0_4_ + auVar116._0_4_)),auVar145,
                                      auVar158);
            fVar89 = 1.0;
            auVar71 = vandps_avx(auVar153,auVar71);
            auVar71 = vmaxss_avx(auVar71,auVar74);
            auVar86._16_16_ = auVar72;
            auVar86._0_16_ = auVar74;
            auVar85._4_28_ = auVar86._4_28_;
            auVar85._0_4_ =
                 (float)((uint)((byte)uVar58 & 1) * auVar73._0_4_ +
                        (uint)!(bool)((byte)uVar58 & 1) * 0x3c23d70a);
            fVar146 = auVar83._0_4_ + auVar83._0_4_ + auVar85._0_4_ + auVar71._0_4_;
            if ((fVar146 != 0.0) || (NAN(fVar146))) {
              auVar72 = vfmadd231ss_fma(ZEXT416((uint)(fVar65 * (1.0 - fVar103) * auVar83._0_4_)),
                                        auVar83._0_16_,
                                        ZEXT416((uint)((1.0 - fVar65) * (1.0 - fVar103))));
              auVar72 = vfmadd213ss_fma(auVar85._0_16_,ZEXT416((uint)(fVar103 * (1.0 - fVar65))),
                                        auVar72);
              auVar72 = vfmadd213ss_fma(auVar71,ZEXT416((uint)(fVar65 * fVar103)),auVar72);
              fVar89 = (auVar72._0_4_ * 4.0) / fVar146;
            }
          }
        }
        fVar89 = (float)auStack_1b8._0_4_ * fVar89;
      }
    }
    return fVar89;
  }
  if (uVar59 == 2) {
    uStack_30 = (undefined4)unaff_RBX;
    uStack_2c = (undefined4)((ulong)unaff_RBX >> 0x20);
    TStack_208._0_8_ = vmovlps_avx(auVar73);
    PVar164 = ShapeSampleContext::OffsetRayOrigin(ctx,(Vector3f *)&TStack_208);
    RStack_58.o.super_Tuple3<pbrt::Point3,_float>.z = PVar164.super_Tuple3<pbrt::Point3,_float>.z;
    auVar95._0_8_ = PVar164.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar95._8_56_ = auVar97._8_56_;
    RStack_58.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar95._0_16_);
    RStack_58.d.super_Tuple3<pbrt::Vector3,_float>.x = TStack_208.x;
    RStack_58.d.super_Tuple3<pbrt::Vector3,_float>.y = TStack_208.y;
    RStack_58.d.super_Tuple3<pbrt::Vector3,_float>.z = TStack_208.z;
    RStack_58.time = ctx->time;
    RStack_58.medium.
    super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
    .bits._0_4_ = 0;
    RStack_58.medium.
    super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
    .bits._4_4_ = 0;
    BilinearPatch::Intersect
              ((optional<pbrt::ShapeIntersection> *)auStack_168,(BilinearPatch *)this_01,&RStack_58,
               INFINITY);
    FVar88 = 0.0;
    if ((bool)auStack_128[0xc0] == true) {
      fVar89 = (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.
               low;
      auVar17._0_4_ =
           (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
      auVar17._4_4_ =
           (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
      auVar17._8_4_ =
           (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
      auVar17._12_4_ =
           (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
      fVar146 = (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.
                high;
      auVar72 = vinsertps_avx(auVar17,ZEXT416((uint)(ctx->pi).super_Point3<pbrt::Interval>.
                                                    super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
                                                    high),0x10);
      mesh = *(BilinearPatchMesh **)
              (*(long *)(BilinearPatch::allMeshes + 8) + (long)*(int *)&this_01->common * 8);
      lVar57 = (long)*(int *)((long)&this_01->common + 4);
      piVar28 = mesh->vertexIndices;
      pPVar29 = mesh->p;
      lVar60 = (long)piVar28[lVar57 * 4];
      unique0x100003cd = lVar60 * 3;
      lVar61 = (long)piVar28[lVar57 * 4 + 1];
      fVar103 = pPVar29[lVar60].super_Tuple3<pbrt::Point3,_float>.z;
      auStack_1c8._0_8_ = lVar61 * 3;
      iVar26 = piVar28[lVar57 * 4 + 2];
      iVar27 = piVar28[lVar57 * 4 + 3];
      uVar3 = pPVar29[iVar27].super_Tuple3<pbrt::Point3,_float>.x;
      uVar11 = pPVar29[iVar27].super_Tuple3<pbrt::Point3,_float>.y;
      auStack_1f8._0_4_ = pPVar29[lVar61].super_Tuple3<pbrt::Point3,_float>.z;
      fVar154 = pPVar29[iVar26].super_Tuple3<pbrt::Point3,_float>.z;
      uStack_1d0 = 0;
      uVar4 = pPVar29[lVar61].super_Tuple3<pbrt::Point3,_float>.x;
      uVar12 = pPVar29[lVar61].super_Tuple3<pbrt::Point3,_float>.y;
      auStack_238._4_4_ = uVar12;
      auStack_238._0_4_ = uVar4;
      auStack_238._8_8_ = 0;
      auStack_1e8._0_4_ = pPVar29[iVar27].super_Tuple3<pbrt::Point3,_float>.z;
      uVar9 = *(undefined8 *)
               &(ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.
                high;
      auVar90._0_4_ = (float)uVar9 + auVar72._0_4_;
      auVar90._4_4_ = (float)((ulong)uVar9 >> 0x20) + auVar72._4_4_;
      auVar90._8_4_ = auVar72._8_4_ + 0.0;
      auVar90._12_4_ = auVar72._12_4_ + 0.0;
      uVar5 = pPVar29[lVar60].super_Tuple3<pbrt::Point3,_float>.x;
      uVar13 = pPVar29[lVar60].super_Tuple3<pbrt::Point3,_float>.y;
      auStack_1b8._4_4_ = uVar13;
      auStack_1b8._0_4_ = uVar5;
      auVar34._8_4_ = 0x3f000000;
      auVar34._0_8_ = 0x3f0000003f000000;
      auVar34._12_4_ = 0x3f000000;
      auVar72 = vmulps_avx512vl(auVar90,auVar34);
      auStack_1b8._8_8_ = 0;
      uVar6 = pPVar29[iVar26].super_Tuple3<pbrt::Point3,_float>.x;
      uVar14 = pPVar29[iVar26].super_Tuple3<pbrt::Point3,_float>.y;
      auStack_228._4_4_ = uVar14;
      auStack_228._0_4_ = uVar6;
      auStack_228._8_8_ = 0;
      fStack_1d8 = (float)uVar3;
      uStack_1d4 = uVar11;
      bVar56 = BilinearPatch::IsRectangle((BilinearPatch *)this_01,mesh);
      if ((bVar56) && (mesh->imageDistribution == (PiecewiseConstant2D *)0x0)) {
        fVar89 = (fVar89 + fVar146) * 0.5;
        fVar103 = fVar103 - fVar89;
        fVar146 = (float)auStack_1f8._0_4_ - fVar89;
        fVar154 = fVar154 - fVar89;
        fVar89 = (float)auStack_1e8._0_4_ - fVar89;
        auVar71 = vsubps_avx(auStack_1b8,auVar72);
        auVar47._4_4_ = uStack_1d4;
        auVar47._0_4_ = fStack_1d8;
        auVar47._8_8_ = uStack_1d0;
        auVar150._0_4_ = auVar71._0_4_ * auVar71._0_4_;
        auVar150._4_4_ = auVar71._4_4_ * auVar71._4_4_;
        auVar150._8_4_ = auVar71._8_4_ * auVar71._8_4_;
        auVar150._12_4_ = auVar71._12_4_ * auVar71._12_4_;
        auVar73 = vhaddps_avx(auVar150,auVar150);
        auVar116 = vsubps_avx(auVar47,auVar72);
        auVar73 = ZEXT416((uint)(auVar73._0_4_ + fVar103 * fVar103));
        auVar73 = vsqrtss_avx(auVar73,auVar73);
        fVar65 = auVar73._0_4_;
        auVar151._4_4_ = fVar65;
        auVar151._0_4_ = fVar65;
        auVar151._8_4_ = fVar65;
        auVar151._12_4_ = fVar65;
        a.super_Tuple3<pbrt::Vector3,_float>.z = fVar103 / fVar65;
        auVar73 = vdivps_avx(auVar71,auVar151);
        auVar74 = vsubps_avx(auStack_238,auVar72);
        auVar112._0_4_ = auVar74._0_4_ * auVar74._0_4_;
        auVar112._4_4_ = auVar74._4_4_ * auVar74._4_4_;
        auVar112._8_4_ = auVar74._8_4_ * auVar74._8_4_;
        auVar112._12_4_ = auVar74._12_4_ * auVar74._12_4_;
        auVar71 = vhaddps_avx(auVar112,auVar112);
        auVar71 = ZEXT416((uint)(auVar71._0_4_ + fVar146 * fVar146));
        auVar71 = vsqrtss_avx(auVar71,auVar71);
        fVar103 = auVar71._0_4_;
        auVar135._4_4_ = fVar103;
        auVar135._0_4_ = fVar103;
        auVar135._8_4_ = fVar103;
        auVar135._12_4_ = fVar103;
        b.super_Tuple3<pbrt::Vector3,_float>.z = fVar146 / fVar103;
        auVar71 = vdivps_avx(auVar74,auVar135);
        auVar74 = vsubps_avx(auStack_228,auVar72);
        auVar113._0_4_ = auVar74._0_4_ * auVar74._0_4_;
        auVar113._4_4_ = auVar74._4_4_ * auVar74._4_4_;
        auVar113._8_4_ = auVar74._8_4_ * auVar74._8_4_;
        auVar113._12_4_ = auVar74._12_4_ * auVar74._12_4_;
        auVar72 = vhaddps_avx(auVar113,auVar113);
        auVar72 = ZEXT416((uint)(auVar72._0_4_ + fVar154 * fVar154));
        auVar72 = vsqrtss_avx(auVar72,auVar72);
        fVar146 = auVar72._0_4_;
        auVar142._4_4_ = fVar146;
        auVar142._0_4_ = fVar146;
        auVar142._8_4_ = fVar146;
        auVar142._12_4_ = fVar146;
        d.super_Tuple3<pbrt::Vector3,_float>.z = fVar154 / fVar146;
        auStack_1e8 = vdivps_avx(auVar74,auVar142);
        auVar136._0_4_ = auVar116._0_4_ * auVar116._0_4_;
        auVar136._4_4_ = auVar116._4_4_ * auVar116._4_4_;
        auVar136._8_4_ = auVar116._8_4_ * auVar116._8_4_;
        auVar136._12_4_ = auVar116._12_4_ * auVar116._12_4_;
        auVar72 = vhaddps_avx(auVar136,auVar136);
        auVar72 = ZEXT416((uint)(fVar89 * fVar89 + auVar72._0_4_));
        auVar72 = vsqrtss_avx(auVar72,auVar72);
        fVar146 = auVar72._0_4_;
        auVar114._4_4_ = fVar146;
        auVar114._0_4_ = fVar146;
        auVar114._8_4_ = fVar146;
        auVar114._12_4_ = fVar146;
        c.super_Tuple3<pbrt::Vector3,_float>.z = fVar89 / fVar146;
        auStack_1f8 = vdivps_avx(auVar116,auVar114);
        a.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar73._0_8_;
        b.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar71._0_8_;
        c.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auStack_1f8._0_8_;
        d.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auStack_1e8._0_8_;
        fStack_1d8 = b.super_Tuple3<pbrt::Vector3,_float>.z;
        FVar88 = SphericalQuadArea(a,b,c,d);
        auVar73 = auStack_1e8;
        auVar72 = auStack_1f8;
        bVar56 = NAN(FVar88);
        bVar64 = FVar88 == 0.0001;
        if (0.0001 < FVar88) {
          a_00.super_Tuple3<pbrt::Vector3,_float>.z = a.super_Tuple3<pbrt::Vector3,_float>.z;
          a_00.super_Tuple3<pbrt::Vector3,_float>.x =
               (float)(int)a.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          a_00.super_Tuple3<pbrt::Vector3,_float>.y =
               (float)(int)((ulong)a.super_Tuple3<pbrt::Vector3,_float>._0_8_ >> 0x20);
          b_00.super_Tuple3<pbrt::Vector3,_float>.z = fStack_1d8;
          b_00.super_Tuple3<pbrt::Vector3,_float>.x =
               (float)(int)b.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          b_00.super_Tuple3<pbrt::Vector3,_float>.y =
               (float)(int)((ulong)b.super_Tuple3<pbrt::Vector3,_float>._0_8_ >> 0x20);
          c_00.super_Tuple3<pbrt::Vector3,_float>.z = c.super_Tuple3<pbrt::Vector3,_float>.z;
          c_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)auStack_1f8._0_4_;
          c_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)auStack_1f8._4_4_;
          d_00.super_Tuple3<pbrt::Vector3,_float>.z = d.super_Tuple3<pbrt::Vector3,_float>.z;
          d_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)auStack_1e8._0_4_;
          d_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)auStack_1e8._4_4_;
          auStack_1f8 = auVar72;
          auStack_1e8 = auVar73;
          FVar88 = SphericalQuadArea(a_00,b_00,c_00,d_00);
          fVar89 = (ctx->ns).super_Tuple3<pbrt::Normal3,_float>.z;
          fVar146 = (ctx->ns).super_Tuple3<pbrt::Normal3,_float>.y;
          auVar72 = vucomiss_avx512f(ZEXT816(0) << 0x40);
          if ((((bVar64) && (!bVar56)) && (fVar146 == 0.0)) && ((fVar89 == 0.0 && (!NAN(fVar89)))))
          {
            return 1.0 / FVar88;
          }
          pPVar1 = pPVar29 + iVar27;
          auVar66 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
          auVar115._4_4_ = fVar89;
          auVar115._0_4_ = fVar89;
          auVar115._8_4_ = fVar89;
          auVar115._12_4_ = fVar89;
          auVar104._4_4_ = fVar146;
          auVar104._0_4_ = fVar146;
          auVar104._8_4_ = fVar146;
          auVar104._12_4_ = fVar146;
          auVar67 = vbroadcastss_avx512vl(auVar72);
          s = &(pPVar29->super_Tuple3<pbrt::Point3,_float>).x + stack0xfffffffffffffe40;
          pfVar2 = &(pPVar29->super_Tuple3<pbrt::Point3,_float>).x + auStack_1c8._0_8_;
          pPVar29 = pPVar29 + iVar26;
          auVar125._8_8_ = 0;
          auVar125._0_8_ = s;
          auVar137._8_8_ = 0;
          auVar137._0_8_ = pfVar2;
          auVar72 = vpunpcklqdq_avx(auVar137,auVar125);
          auVar138._8_8_ = 0;
          auVar138._0_8_ = pPVar29;
          auVar140._8_8_ = 0;
          auVar140._0_8_ = pPVar1;
          auVar73 = vpunpcklqdq_avx(auVar140,auVar138);
          auVar133._0_16_ = ZEXT116(0) * auVar72 + ZEXT116(1) * auVar73;
          auVar133._16_16_ = ZEXT116(1) * auVar72;
          auVar45._8_4_ = 8;
          auVar45._0_8_ = 8;
          auVar45._12_4_ = 0;
          auVar45._16_8_ = 8;
          auVar45._24_8_ = 8;
          auVar76 = vpaddq_avx512vl(auVar133,auVar45);
          auVar18._0_4_ =
               (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.
               low;
          auVar18._4_4_ =
               (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.
               high;
          auVar18._8_4_ =
               (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
               low;
          auVar18._12_4_ =
               (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
               high;
          uVar9 = *(undefined8 *)
                   &(ctx->pi).super_Point3<pbrt::Interval>.
                    super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
          auVar72 = vinsertps_avx(auVar18,ZEXT416((uint)(ctx->pi).super_Point3<pbrt::Interval>.
                                                        super_Tuple3<pbrt::Point3,_pbrt::Interval>.y
                                                        .high),0x10);
          auVar139._0_4_ = (float)uVar9 + auVar72._0_4_;
          auVar139._4_4_ = (float)((ulong)uVar9 >> 0x20) + auVar72._4_4_;
          auVar139._8_4_ = auVar72._8_4_ + 0.0;
          auVar139._12_4_ = auVar72._12_4_ + 0.0;
          auVar87 = auVar76._16_16_;
          auVar72 = vmulps_avx512vl(auVar139,auVar66);
          auStack_178 = (undefined1  [8])vmovlps_avx(auVar72);
          fStack_170 = ((ctx->pi).super_Point3<pbrt::Interval>.
                        super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low +
                       (ctx->pi).super_Point3<pbrt::Interval>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) * 0.5;
          uVar7 = (pPVar1->super_Tuple3<pbrt::Point3,_float>).x;
          uVar15 = (pPVar1->super_Tuple3<pbrt::Point3,_float>).y;
          auVar157._4_4_ = uVar15;
          auVar157._0_4_ = uVar7;
          auVar157._8_8_ = 0;
          uVar8 = (pPVar29->super_Tuple3<pbrt::Point3,_float>).x;
          uVar16 = (pPVar29->super_Tuple3<pbrt::Point3,_float>).y;
          auVar163._4_4_ = uVar16;
          auVar163._0_4_ = uVar8;
          auVar163._8_8_ = 0;
          auVar152._8_8_ = 0;
          auVar152._0_8_ = *(ulong *)s;
          auVar161._8_8_ = 0;
          auVar161._0_8_ = *(ulong *)pfVar2;
          auVar73 = vsubps_avx(auVar157,auVar72);
          auVar68 = vsubps_avx512vl(auVar163,auVar72);
          auVar116 = vsubps_avx(auVar152,auVar72);
          auVar74 = vsubps_avx(auVar161,auVar72);
          auVar69 = vgatherqps_avx512vl(*(undefined8 *)s);
          auVar143._4_4_ = fStack_170;
          auVar143._0_4_ = fStack_170;
          auVar143._8_4_ = fStack_170;
          auVar143._12_4_ = fStack_170;
          auVar159._0_4_ = auVar73._0_4_ * auVar73._0_4_;
          auVar159._4_4_ = auVar73._4_4_ * auVar73._4_4_;
          auVar159._8_4_ = auVar73._8_4_ * auVar73._8_4_;
          auVar159._12_4_ = auVar73._12_4_ * auVar73._12_4_;
          auVar72 = vmulps_avx512vl(auVar68,auVar68);
          auVar162._0_4_ = auVar74._0_4_ * auVar74._0_4_;
          auVar162._4_4_ = auVar74._4_4_ * auVar74._4_4_;
          auVar162._8_4_ = auVar74._8_4_ * auVar74._8_4_;
          auVar162._12_4_ = auVar74._12_4_ * auVar74._12_4_;
          auVar155._0_4_ = auVar116._0_4_ * auVar116._0_4_;
          auVar155._4_4_ = auVar116._4_4_ * auVar116._4_4_;
          auVar155._8_4_ = auVar116._8_4_ * auVar116._8_4_;
          auVar155._12_4_ = auVar116._12_4_ * auVar116._12_4_;
          auVar70 = vunpcklps_avx512vl(auVar159,auVar72);
          auVar75 = vsubps_avx(auVar69,auVar143);
          auVar71 = vinsertps_avx512f(auVar72,auVar159,0x4c);
          auVar72 = vmovlhps_avx512f(auVar70,auVar162);
          auVar70 = vinsertps_avx512f(auVar72,auVar155,0x30);
          auVar72 = vshufps_avx(auVar155,auVar162,0x55);
          auVar72 = vshufps_avx(auVar71,auVar72,0x24);
          auVar72 = vaddps_avx512vl(auVar70,auVar72);
          auVar147._0_4_ = auVar72._0_4_ + auVar75._0_4_ * auVar75._0_4_;
          auVar147._4_4_ = auVar72._4_4_ + auVar75._4_4_ * auVar75._4_4_;
          auVar147._8_4_ = auVar72._8_4_ + auVar75._8_4_ * auVar75._8_4_;
          auVar147._12_4_ = auVar72._12_4_ + auVar75._12_4_ * auVar75._12_4_;
          auVar72 = vunpcklps_avx512vl(auVar73,auVar68);
          auVar73 = vinsertps_avx512f(auVar68,auVar73,0x4c);
          auVar72 = vmovlhps_avx(auVar72,auVar74);
          auVar71 = vinsertps_avx(auVar72,auVar116,0x30);
          auVar72 = vshufps_avx(auVar116,auVar74,0x55);
          auVar116 = vsqrtps_avx(auVar147);
          auVar73 = vshufps_avx(auVar73,auVar72,0x24);
          auVar72 = vdivps_avx(auVar75,auVar116);
          auVar73 = vdivps_avx(auVar73,auVar116);
          auVar71 = vdivps_avx(auVar71,auVar116);
          auVar148._0_4_ = fVar89 * auVar72._0_4_;
          auVar148._4_4_ = fVar89 * auVar72._4_4_;
          auVar148._8_4_ = fVar89 * auVar72._8_4_;
          auVar148._12_4_ = fVar89 * auVar72._12_4_;
          auVar73 = vfmadd213ps_fma(auVar104,auVar73,auVar148);
          auVar72 = vfmsub213ps_fma(auVar72,auVar115,auVar148);
          auVar105._0_4_ = auVar73._0_4_ + auVar72._0_4_;
          auVar105._4_4_ = auVar73._4_4_ + auVar72._4_4_;
          auVar105._8_4_ = auVar73._8_4_ + auVar72._8_4_;
          auVar105._12_4_ = auVar73._12_4_ + auVar72._12_4_;
          auVar72 = vfmadd213ps_fma(auVar67,auVar71,auVar105);
          auVar106._8_8_ = 0;
          auVar106._0_8_ = *(ulong *)s;
          auVar35._8_4_ = 0x7fffffff;
          auVar35._0_8_ = 0x7fffffff7fffffff;
          auVar35._12_4_ = 0x7fffffff;
          auVar71 = vandps_avx512vl(auVar72,auVar35);
          auVar72 = vhsubps_avx(auVar69,auVar69);
          auVar36._8_4_ = 0x3c23d70a;
          auVar36._0_8_ = 0x3c23d70a3c23d70a;
          auVar36._12_4_ = 0x3c23d70a;
          uVar9 = vcmpps_avx512vl(auVar71,auVar36,0xe);
          bVar46 = (byte)uVar9;
          auVar73 = vsubps_avx(auVar161,auVar106);
          auStack_188 = (undefined1  [8])vmovlps_avx(auVar73);
          uStack_180._0_4_ = (float)vextractps_avx(auVar72,3);
          auVar72 = vsubps_avx(auVar163,auVar106);
          auVar73 = vmovshdup_avx(auVar69);
          auStack_198._0_8_ = vmovlps_avx(auVar72);
          auVar48._4_4_ = auStack_168._4_4_;
          auVar48._0_4_ = auStack_168._0_4_;
          auVar48._8_4_ = auStack_168._8_4_;
          auVar48._12_4_ = auStack_168._12_4_;
          auVar72 = vinsertps_avx(auVar48,ZEXT416((uint)auStack_168._12_4_),0x10);
          auStack_198._8_4_ = auVar73._0_4_ - s[2];
          auVar91._0_4_ = (float)auStack_168._4_4_ + auVar72._0_4_;
          auVar91._4_4_ = (float)auStack_168._8_4_ + auVar72._4_4_;
          auVar91._8_4_ = auVar72._8_4_ + 0.0;
          auVar91._12_4_ = auVar72._12_4_ + 0.0;
          auVar72 = vmulps_avx512vl(auVar91,auVar66);
          auStack_1a8._0_8_ = vmovlps_avx(auVar72);
          auStack_1a8._8_4_ = ((float)auStack_168._16_4_ + (float)auStack_168._20_4_) * 0.5;
          auVar96._0_8_ =
               InvertSphericalRectangleSample
                         ((Point3f *)auStack_178,(Point3f *)s,(Vector3f *)auStack_188,
                          (Vector3f *)auStack_198,(Point3f *)auStack_1a8);
          auVar96._8_56_ = extraout_var;
          fVar146 = 0.0;
          fVar89 = auVar96._0_4_;
          if ((0.0 <= fVar89) && (fVar89 <= 1.0)) {
            auVar72 = vmovshdup_avx(auVar96._0_16_);
            fVar103 = auVar72._0_4_;
            if ((0.0 <= fVar103) && (fVar103 <= 1.0)) {
              auVar72 = vshufps_avx(auVar71,auVar71,0xff);
              auVar73 = vshufps_avx(auVar71,auVar71,0x4e);
              auVar116 = SUB6416(ZEXT464(0x3c23d70a),0);
              auVar78._16_16_ = auVar87;
              auVar78._0_16_ = auVar116;
              auVar77._4_28_ = auVar78._4_28_;
              auVar77._0_4_ =
                   (float)((uint)(bVar46 >> 3 & 1) * auVar72._0_4_ +
                          (uint)!(bool)(bVar46 >> 3 & 1) * 0x3c23d70a);
              fVar65 = (float)((uint)(bVar46 >> 2 & 1) * auVar73._0_4_ +
                              (uint)!(bool)(bVar46 >> 2 & 1) * 0x3c23d70a);
              auVar72 = vshufps_avx(auVar71,auVar71,0xf5);
              auVar80._16_16_ = auVar87;
              auVar80._0_16_ = auVar116;
              auVar79._4_28_ = auVar80._4_28_;
              auVar79._0_4_ =
                   (float)((uint)(bVar46 & 1) * auVar71._0_4_ +
                          (uint)!(bool)(bVar46 & 1) * 0x3c23d70a);
              auVar82._16_16_ = auVar87;
              auVar82._0_16_ = auVar116;
              auVar81._4_28_ = auVar82._4_28_;
              auVar81._0_4_ =
                   (float)((uint)(bVar46 >> 1 & 1) * auVar72._0_4_ +
                          (uint)!(bool)(bVar46 >> 1 & 1) * 0x3c23d70a);
              fVar154 = auVar77._0_4_ + fVar65 + auVar81._0_4_ + auVar79._0_4_;
              fVar146 = 1.0;
              if ((fVar154 != 0.0) || (NAN(fVar154))) {
                auVar72 = vfmadd213ss_fma(auVar77._0_16_,
                                          ZEXT416((uint)((1.0 - fVar89) * (1.0 - fVar103))),
                                          ZEXT416((uint)(fVar89 * (1.0 - fVar103) * fVar65)));
                auVar72 = vfmadd213ss_fma(auVar81._0_16_,ZEXT416((uint)((1.0 - fVar89) * fVar103)),
                                          auVar72);
                auVar72 = vfmadd213ss_fma(auVar79._0_16_,ZEXT416((uint)(fVar89 * fVar103)),auVar72);
                fVar146 = (auVar72._0_4_ * 4.0) / fVar154;
              }
            }
          }
          return (1.0 / FVar88) * fVar146;
        }
      }
      FVar88 = BilinearPatch::PDF((BilinearPatch *)this_01,(Interaction *)auStack_168);
      auVar51._4_4_ = auStack_168._8_4_;
      auVar51._0_4_ = auStack_168._4_4_;
      auVar51._8_4_ = auStack_168._12_4_;
      auVar51._12_4_ = auStack_168._16_4_;
      auVar49._4_4_ = auStack_168._4_4_;
      auVar49._0_4_ = auStack_168._0_4_;
      auVar49._8_4_ = auStack_168._8_4_;
      auVar49._12_4_ = auStack_168._12_4_;
      auVar37._8_4_ = 0x80000000;
      auVar37._0_8_ = 0x8000000080000000;
      auVar37._12_4_ = 0x80000000;
      auVar73 = vxorps_avx512vl(ZEXT416((uint)TStack_208.z),auVar37);
      auVar72 = vinsertps_avx(auVar51,ZEXT416((uint)auStack_168._20_4_),0x10);
      auVar73 = ZEXT416((uint)((float)auStack_148._16_4_ * auVar73._0_4_));
      auVar71 = vfnmadd132ss_fma(ZEXT416((uint)auStack_148._12_4_),auVar73,
                                 ZEXT416((uint)TStack_208.y));
      auVar116 = vfnmsub213ss_fma(ZEXT416((uint)TStack_208.z),ZEXT416((uint)auStack_148._16_4_),
                                  auVar73);
      auVar19._0_4_ =
           (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
      auVar19._4_4_ =
           (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
      auVar19._8_4_ =
           (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
      auVar19._12_4_ =
           (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
      auVar73 = vinsertps_avx(auVar19,ZEXT416((uint)(ctx->pi).super_Point3<pbrt::Interval>.
                                                    super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low
                                             ),0x10);
      auVar116 = vfnmadd231ss_fma(ZEXT416((uint)(auVar71._0_4_ + auVar116._0_4_)),
                                  ZEXT416((uint)auStack_148._8_4_),ZEXT416((uint)TStack_208.x));
      auVar71 = vinsertps_avx(*(undefined1 (*) [16])
                               &(ctx->pi).super_Point3<pbrt::Interval>.
                                super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high,
                              ZEXT416((uint)(ctx->pi).super_Point3<pbrt::Interval>.
                                            super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high),0x10)
      ;
      auVar38._8_4_ = 0x7fffffff;
      auVar38._0_8_ = 0x7fffffff7fffffff;
      auVar38._12_4_ = 0x7fffffff;
      auVar74 = vandps_avx512vl(auVar116,auVar38);
      fVar89 = ((ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
                low + (ctx->pi).super_Point3<pbrt::Interval>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high) * 0.5 -
               ((float)auStack_168._8_4_ + (float)auStack_168._12_4_) * 0.5;
      auVar116 = vinsertps_avx(auVar49,ZEXT416((uint)auStack_168._16_4_),0x10);
      auVar117._0_4_ = (auVar73._0_4_ + auVar71._0_4_) * 0.5;
      auVar117._4_4_ = (auVar73._4_4_ + auVar71._4_4_) * 0.5;
      auVar117._8_4_ = (auVar73._8_4_ + auVar71._8_4_) * 0.5;
      auVar117._12_4_ = (auVar73._12_4_ + auVar71._12_4_) * 0.5;
      auVar126._0_4_ = (auVar116._0_4_ + auVar72._0_4_) * 0.5;
      auVar126._4_4_ = (auVar116._4_4_ + auVar72._4_4_) * 0.5;
      auVar126._8_4_ = (auVar116._8_4_ + auVar72._8_4_) * 0.5;
      auVar126._12_4_ = (auVar116._12_4_ + auVar72._12_4_) * 0.5;
      auVar72 = vsubps_avx(auVar117,auVar126);
      auVar118._0_4_ = auVar72._0_4_ * auVar72._0_4_;
      auVar118._4_4_ = auVar72._4_4_ * auVar72._4_4_;
      auVar118._8_4_ = auVar72._8_4_ * auVar72._8_4_;
      auVar118._12_4_ = auVar72._12_4_ * auVar72._12_4_;
      auVar72 = vmovshdup_avx(auVar118);
      fVar89 = FVar88 / (auVar74._0_4_ / (auVar118._0_4_ + fVar89 * fVar89 + auVar72._0_4_));
      FVar88 = (Float)((uint)(ABS(fVar89) != INFINITY) * (int)fVar89);
    }
    return FVar88;
  }
  FVar88 = Curve::PDF(this_01,ctx,wi);
  return FVar88;
}

Assistant:

PBRT_CPU_GPU
    TaggedPointer(const TaggedPointer &t) { bits = t.bits; }